

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MinDistanceShapeIndexTarget::UpdateMinDistance
          (S2MinDistanceShapeIndexTarget *this,S2Point *v0,S2Point *v1,S2MinDistance *min_dist)

{
  S2ClosestEdgeQuery *pSVar1;
  Result RVar2;
  Options local_58;
  Target local_40;
  VType local_38;
  VType VStack_30;
  VType local_28;
  VType local_20;
  VType VStack_18;
  VType local_10;
  
  local_28 = v0->c_[2];
  local_38 = v0->c_[0];
  VStack_30 = v0->c_[1];
  local_20 = v1->c_[0];
  VStack_18 = v1->c_[1];
  local_10 = v1->c_[2];
  local_40._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_002bbb58;
  *(double *)
   &(((this->query_)._M_t.
      super___uniq_ptr_impl<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>_>._M_t.
      super__Tuple_impl<0UL,_S2ClosestEdgeQuery_*,_std::default_delete<S2ClosestEdgeQuery>_>.
      super__Head_base<0UL,_S2ClosestEdgeQuery_*,_false>._M_head_impl)->options_).super_Options =
       (min_dist->super_S1ChordAngle).length2_;
  pSVar1 = (this->query_)._M_t.
           super___uniq_ptr_impl<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>_>._M_t.
           super__Tuple_impl<0UL,_S2ClosestEdgeQuery_*,_std::default_delete<S2ClosestEdgeQuery>_>.
           super__Head_base<0UL,_S2ClosestEdgeQuery_*,_false>._M_head_impl;
  local_58.max_distance_.super_S1ChordAngle.length2_ =
       *(S1ChordAngle *)&(pSVar1->options_).super_Options;
  local_58.max_error_.length2_ = ((Delta *)((long)&(pSVar1->options_).super_Options + 8))->length2_;
  local_58._20_4_ =
       SUB84((ulong)*(undefined8 *)((long)&(pSVar1->options_).super_Options + 0x10) >> 0x20,0);
  local_58.max_results_ = 1;
  RVar2 = S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdge(&pSVar1->base_,&local_40,&local_58)
  ;
  if (-1 < RVar2.shape_id_) {
    (min_dist->super_S1ChordAngle).length2_ = (double)RVar2.distance_.super_S1ChordAngle.length2_;
  }
  return -1 < RVar2.shape_id_;
}

Assistant:

bool S2MinDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MinDistance* min_dist) {
  S2ClosestEdgeQuery::EdgeTarget target(v0, v1);
  return UpdateMinDistance(&target, min_dist);
}